

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3879a::BuildSystemTaskTests_staleFileRemoval_Test::TestBody
          (BuildSystemTaskTests_staleFileRemoval_Test *this)

{
  element_type *this_00;
  int iVar1;
  pointer pcVar2;
  char *pcVar3;
  size_t sVar4;
  BuildValue *pBVar5;
  FileSystem *pFVar6;
  MockBuildSystemDelegate *EC;
  long lVar7;
  AssertionResult *pAVar8;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar9;
  long *plVar10;
  _func_int **message;
  char *in_R9;
  char *pcVar11;
  bool bVar12;
  StringRef namePrefix;
  StringRef Filename;
  StringRef path;
  StringRef mainFilename;
  StringRef Filename_00;
  StringRef path_00;
  StringRef mainFilename_00;
  StringRef name;
  allocator local_5ba;
  allocator local_5b9;
  AssertionResult gtest_ar__1;
  BuildSystem system_1;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_590;
  allocator local_582;
  allocator local_581;
  AssertionResult gtest_ar__3;
  shared_ptr<(anonymous_namespace)::LoggingFileSystem> mockFS;
  BuildSystem system;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_548;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_540;
  Optional<llbuild::buildsystem::BuildValue> result_1;
  Optional<llbuild::buildsystem::BuildValue> result;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  string local_3a0 [32];
  string local_380 [32];
  SmallString<256U> builddb;
  SmallString<256U> manifest;
  TmpDir tempDir;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&tempDir,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&builddb,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&manifest.super_SmallVector<char,_256U>,
             (char *)builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ +
                     (long)builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&builddb,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&delegate,"");
  llvm::Twine::Twine((Twine *)&result_1,"");
  llvm::Twine::Twine((Twine *)&result,"");
  llvm::sys::path::append
            (&manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&builddb,
             (Twine *)&delegate,(Twine *)&result_1,(Twine *)&result);
  delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate._0_4_ = 0;
  pcVar2 = (pointer)std::_V2::system_category();
  EC = &delegate;
  Filename.Length._4_4_ = 0;
  Filename._0_12_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  delegate.super_BuildSystemDelegate.name._M_dataplus._M_p = pcVar2;
  llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&builddb,Filename,(error_code *)EC,F_Text);
  if ((int)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x216,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemoval_Test::TestBody()"
                 );
  }
  llvm::raw_ostream::operator<<
            ((raw_ostream *)&builddb,
             "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      description: STALE-FILE-REMOVAL\n      expectedOutputs: [\"a.out\"]\n"
            );
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&builddb);
  name.Length = (size_t)EC;
  name.Data = (char *)0x3;
  llbuild::buildsystem::BuildKey::makeCommand(&keyToBuild,(BuildKey *)"C.1",name);
  llbuild::TmpDir::str_abi_cxx11_((string *)&delegate,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&builddb.super_SmallVector<char,_256U>,
             (char *)CONCAT44(delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate._4_4_,
                              (int)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate),
             delegate.super_BuildSystemDelegate.name._M_dataplus._M_p +
             (long)CONCAT44(delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate._4_4_,
                            (int)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate));
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&delegate,"build.db");
  pcVar11 = "";
  llvm::Twine::Twine((Twine *)&result_1,"");
  llvm::Twine::Twine((Twine *)&result,"");
  llvm::Twine::Twine((Twine *)&gtest_ar__1,"");
  llvm::sys::path::append
            (&builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&delegate,
             (Twine *)&result_1,(Twine *)&result,(Twine *)&gtest_ar__1);
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate(&delegate,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&system_1,&delegate.super_BuildSystemDelegate,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_540);
  if (local_540._M_head_impl != (FileSystem *)0x0) {
    (*(local_540._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_540._M_head_impl = (FileSystem *)0x0;
  pcVar3 = llvm::SmallString<256U>::c_str(&builddb);
  if (pcVar3 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(pcVar3);
  }
  path.Length = sVar4;
  path.Data = pcVar3;
  llbuild::buildsystem::BuildSystem::attachDB(&system_1,path,(string *)0x0);
  mainFilename.Length._4_4_ = 0;
  mainFilename._0_12_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0] =
       llbuild::buildsystem::BuildSystem::loadDescription(&system_1,mainFilename);
  pcVar3 = result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 8;
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[8] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[9] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[10] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xb] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xc] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xd] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xe] = '\0';
  result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xf] = '\0';
  if ((bool)result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0]) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pcVar3);
    std::__cxx11::string::string(local_380,(string *)&keyToBuild);
    llbuild::buildsystem::BuildSystem::build(&result_1,&system_1,(BuildKey *)local_380);
    std::__cxx11::string::_M_dispose();
    gtest_ar__1.success_ = result_1.Storage.hasVal;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (result_1.Storage.hasVal == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result,(internal *)&gtest_ar__1,(AssertionResult *)"result.hasValue()",
                 "false","true",in_R9);
      pcVar11 = (char *)CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer.
                                 _1_7_,result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer[0]);
      iVar1 = 0x233;
LAB_00126faf:
      puVar9 = &gtest_ar__1.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mockFS,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,iVar1,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mockFS,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mockFS);
      std::__cxx11::string::_M_dispose();
      if (gtest_ar__3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result_1);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bVar12 = pBVar5->kind == StaleFileRemoval;
      gtest_ar__1.success_ = bVar12;
      if (!bVar12) {
        testing::Message::Message((Message *)&gtest_ar__3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&result,(internal *)&gtest_ar__1,
                   (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9)
        ;
        pcVar11 = (char *)CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer.
                                   _1_7_,result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                         buffer[0]);
        iVar1 = 0x234;
        goto LAB_00126faf;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result_1);
      llbuild::buildsystem::BuildValue::getStaleFileList
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&result,pBVar5);
      gtest_ar__3._0_8_ =
           result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._8_8_ -
           CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._1_7_,
                    result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0]) >> 4;
      mockFS.
      super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar__1,"result.getValue().getStaleFileList().size()","1UL",
                 (unsigned_long *)&gtest_ar__3,(unsigned_long *)&mockFS);
      std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&result);
      if (gtest_ar__1.success_ == false) {
        testing::Message::Message((Message *)&result);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar11 = *(char **)gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        pAVar8 = &gtest_ar__1;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x235,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&result);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
        plVar10 = (long *)CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer.
                                   _1_7_,result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                         buffer[0]);
LAB_001270ab:
        puVar9 = &pAVar8->message_;
        if (plVar10 != (long *)0x0) {
          (**(code **)(*plVar10 + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result_1);
        llbuild::buildsystem::BuildValue::getStaleFileList
                  ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar__1,pBVar5)
        ;
        llvm::StringRef::str_abi_cxx11_((string *)&result,(StringRef *)gtest_ar__1._0_8_);
        iVar1 = strcmp((char *)CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                        buffer._1_7_,
                                        result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                        buffer[0]),"a.out");
        puVar9 = &gtest_ar__3.message_;
        gtest_ar__3.success_ = iVar1 == 0;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::__cxx11::string::_M_dispose();
        std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                  ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar__1);
        if (gtest_ar__3.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar9);
          std::__cxx11::string::string
                    ((string *)&result,"commandPreparing(C.1)",(allocator *)&system);
          std::__cxx11::string::string
                    ((string *)
                     (result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x20),
                     "commandStarted(C.1)",&local_5ba);
          std::__cxx11::string::string
                    ((string *)
                     (result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x40),
                     "commandFinished(C.1: 0)",&local_5b9);
          gtest_ar__1.success_ = false;
          gtest_ar__1._1_7_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &gtest_ar__1,(string *)&result,
                     result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x60);
          llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gtest_ar__3,&delegate);
          testing::internal::
          CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((internal *)&mockFS,
                     "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
                     ,"delegate.getMessages()",
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gtest_ar__1,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gtest_ar__3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar__3);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar__1);
          lVar7 = 0x40;
          do {
            std::__cxx11::string::_M_dispose();
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != -0x20);
          if ((char)mockFS.
                    super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr == '\0') {
            testing::Message::Message((Message *)&result);
            if (mockFS.
                super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              message = (_func_int **)0x1dca0f;
            }
            else {
              message = (mockFS.
                         super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base;
            }
            pAVar8 = (AssertionResult *)
                     &mockFS.
                      super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
            ;
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x23c,(char *)message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__1,(Message *)&result);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
            plVar10 = (long *)CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._1_7_,
                                       result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer[0]);
            goto LAB_001270ab;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&mockFS.
                            super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
          llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
                    (&result_1.Storage);
          llbuild::buildsystem::BuildSystem::~BuildSystem(&system_1);
          llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
          result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0] = '\0';
          result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[1] = '\0';
          result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[2] = '\0';
          result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[3] = '\0';
          Filename_00.Length._4_4_ = 0;
          Filename_00._0_12_ =
               manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase._0_12_;
          result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._8_8_ = pcVar2;
          llvm::raw_fd_ostream::raw_fd_ostream
                    ((raw_fd_ostream *)&delegate,Filename_00,(error_code *)&result_1,F_Text);
          if (result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_4_ != 0) {
            __assert_fail("!ec",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                          ,0x242,
                          "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemoval_Test::TestBody()"
                         );
          }
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)&delegate,
                     "\nclient:\n  name: mock\n\ncommands:\n  C.1:\n    tool: stale-file-removal\n    description: STALE-FILE-REMOVAL\n    expectedOutputs: [\"b.out\"]\n"
                    );
          llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&delegate);
          std::make_shared<(anonymous_namespace)::LoggingFileSystem>();
          pFVar6 = (FileSystem *)operator_new(0x10);
          this_00 = mockFS.
                    super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          pFVar6->_vptr_FileSystem = (_func_int **)&PTR__FileSystem_0023b428;
          pFVar6[1]._vptr_FileSystem =
               (_func_int **)
               mockFS.
               super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate(&delegate,true);
          local_548._M_head_impl = pFVar6;
          llbuild::buildsystem::BuildSystem::BuildSystem
                    (&system,&delegate.super_BuildSystemDelegate,
                     (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                      *)&local_548);
          if (local_548._M_head_impl != (FileSystem *)0x0) {
            (*(local_548._M_head_impl)->_vptr_FileSystem[1])();
          }
          local_548._M_head_impl = (FileSystem *)0x0;
          pcVar11 = llvm::SmallString<256U>::c_str(&builddb);
          if (pcVar11 == (char *)0x0) {
            sVar4 = 0;
          }
          else {
            sVar4 = strlen(pcVar11);
          }
          path_00.Length = sVar4;
          path_00.Data = pcVar11;
          llbuild::buildsystem::BuildSystem::attachDB(&system,path_00,(string *)0x0);
          mainFilename_00.Length._4_4_ = 0;
          mainFilename_00._0_12_ =
               manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase._0_12_;
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0] =
               llbuild::buildsystem::BuildSystem::loadDescription(&system,mainFilename_00);
          pcVar11 = result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 8;
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[8] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[9] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[10] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xb] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xc] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xd] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xe] = '\0';
          result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0xf] = '\0';
          if ((bool)result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0]) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pcVar11);
            std::__cxx11::string::string(local_3a0,(string *)&keyToBuild);
            llbuild::buildsystem::BuildSystem::build(&result,&system,(BuildKey *)local_3a0);
            std::__cxx11::string::_M_dispose();
            puVar9 = &gtest_ar__1.message_;
            gtest_ar__1.success_ = result.Storage.hasVal;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (result.Storage.hasVal == false) {
              pAVar8 = &gtest_ar__3;
              testing::Message::Message((Message *)pAVar8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&result_1,(internal *)&gtest_ar__1,
                         (AssertionResult *)"result.hasValue()","false","true",in_R9);
              pcVar11 = (char *)CONCAT44(result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>
                                         .buffer._4_4_,
                                         result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>
                                         .buffer._0_4_);
              iVar1 = 0x259;
LAB_001274e7:
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&system_1,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,iVar1,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&system_1,(Message *)pAVar8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&system_1);
              std::__cxx11::string::_M_dispose();
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )*(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pAVar8 !=
                  (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)*(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)pAVar8 + 8))();
              }
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(puVar9);
              pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
              puVar9 = &gtest_ar__1.message_;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              bVar12 = pBVar5->kind == StaleFileRemoval;
              gtest_ar__1.success_ = bVar12;
              if (!bVar12) {
                pAVar8 = &gtest_ar__3;
                testing::Message::Message((Message *)pAVar8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&result_1,(internal *)&gtest_ar__1,
                           (AssertionResult *)"result.getValue().isStaleFileRemoval()","false",
                           "true",in_R9);
                pcVar11 = (char *)CONCAT44(result_1.Storage.storage.
                                           super_AlignedCharArray<8UL,_112UL>.buffer._4_4_,
                                           result_1.Storage.storage.
                                           super_AlignedCharArray<8UL,_112UL>.buffer._0_4_);
                iVar1 = 0x25a;
                goto LAB_001274e7;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(puVar9);
              pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
              llbuild::buildsystem::BuildValue::getStaleFileList
                        ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&result_1,
                         pBVar5);
              gtest_ar__3._0_8_ =
                   result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._8_8_ -
                   CONCAT44(result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._4_4_
                            ,result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer.
                             _0_4_) >> 4;
              system_1.impl = (void *)0x1;
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                        ((internal *)&gtest_ar__1,"result.getValue().getStaleFileList().size()",
                         "1UL",(unsigned_long *)&gtest_ar__3,(unsigned_long *)&system_1);
              std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                        ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                         &result_1);
              if (gtest_ar__1.success_ == false) {
                testing::Message::Message((Message *)&result_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar11 = "";
                }
                else {
                  pcVar11 = *(char **)gtest_ar__1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                puVar9 = &gtest_ar__1.message_;
                pAVar8 = &gtest_ar__3;
                iVar1 = 0x25b;
LAB_00127753:
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)pAVar8,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                           ,iVar1,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)pAVar8,(Message *)&result_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar8);
                if ((long *)CONCAT44(result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                     buffer._4_4_,
                                     result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                     buffer._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(result_1.Storage.storage.
                                                 super_AlignedCharArray<8UL,_112UL>.buffer._4_4_,
                                                 result_1.Storage.storage.
                                                 super_AlignedCharArray<8UL,_112UL>.buffer._0_4_) +
                              8))();
                }
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__1.message_);
                pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
                llbuild::buildsystem::BuildValue::getStaleFileList
                          ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar__1
                           ,pBVar5);
                llvm::StringRef::str_abi_cxx11_((string *)&result_1,(StringRef *)gtest_ar__1._0_8_);
                iVar1 = strcmp((char *)CONCAT44(result_1.Storage.storage.
                                                super_AlignedCharArray<8UL,_112UL>.buffer._4_4_,
                                                result_1.Storage.storage.
                                                super_AlignedCharArray<8UL,_112UL>.buffer._0_4_),
                               "b.out");
                puVar9 = &gtest_ar__3.message_;
                gtest_ar__3.success_ = iVar1 == 0;
                gtest_ar__3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::__cxx11::string::_M_dispose();
                std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                          ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                           &gtest_ar__1);
                if (iVar1 != 0) {
                  pAVar8 = &gtest_ar__1;
                  testing::Message::Message((Message *)pAVar8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&result_1,(internal *)&gtest_ar__3,
                             (AssertionResult *)
                             "strcmp(result.getValue().getStaleFileList()[0].str().c_str(), \"b.out\") == 0"
                             ,"false","true",in_R9);
                  pcVar11 = (char *)CONCAT44(result_1.Storage.storage.
                                             super_AlignedCharArray<8UL,_112UL>.buffer._4_4_,
                                             result_1.Storage.storage.
                                             super_AlignedCharArray<8UL,_112UL>.buffer._0_4_);
                  iVar1 = 0x25c;
                  goto LAB_001274e7;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(puVar9);
                std::__cxx11::string::string((string *)&result_1,"a.out",&local_5ba);
                gtest_ar__1.success_ = false;
                gtest_ar__1._1_7_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_initialize<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &gtest_ar__1,(string *)&result_1,
                           result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer + 0x20
                          );
                (anonymous_namespace)::LoggingFileSystem::getDeletedPaths_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__3,this_00);
                testing::internal::
                CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((internal *)&system_1,"std::vector<std::string>({ \"a.out\" })",
                           "mockFS->getDeletedPaths()",
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__1,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__3);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar__3);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar__1);
                std::__cxx11::string::_M_dispose();
                if ((char)system_1.impl == '\0') {
                  testing::Message::Message((Message *)&result_1);
                  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )local_590._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar11 = "";
                  }
                  else {
                    pcVar11 = *(char **)local_590._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl;
                  }
                  puVar9 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_590;
                  pAVar8 = &gtest_ar__1;
                  iVar1 = 0x25e;
                  goto LAB_00127753;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_590);
                std::__cxx11::string::string((string *)&result_1,"commandPreparing(C.1)",&local_5ba)
                ;
                std::__cxx11::string::string
                          ((string *)
                           (result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer +
                           0x20),"commandStarted(C.1)",&local_5b9);
                std::__cxx11::string::string
                          ((string *)
                           (result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer +
                           0x40),"commandNote(C.1) Removed stale file \'a.out\'\n",&local_581);
                std::__cxx11::string::string
                          ((string *)
                           (result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer +
                           0x60),"commandFinished(C.1: 0)",&local_582);
                gtest_ar__1.success_ = false;
                gtest_ar__1._1_7_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_initialize<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &gtest_ar__1,(string *)&result_1,&result);
                llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__3,&delegate);
                testing::internal::
                CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((internal *)&system_1,
                           "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandNote(C.1) Removed stale file \'a.out\'\\n\", \"commandFinished(C.1: 0)\", })"
                           ,"delegate.getMessages()",
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__1,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__3);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar__3);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&gtest_ar__1);
                lVar7 = 0x60;
                do {
                  std::__cxx11::string::_M_dispose();
                  lVar7 = lVar7 + -0x20;
                } while (lVar7 != -0x20);
                if ((char)system_1.impl == '\0') {
                  testing::Message::Message((Message *)&result_1);
                  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )local_590._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar11 = "";
                  }
                  else {
                    pcVar11 = *(char **)local_590._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                             ,0x265,pcVar11);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__1,(Message *)&result_1);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
                  if ((long *)CONCAT44(result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._4_4_,
                                       result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(result_1.Storage.storage.
                                                   super_AlignedCharArray<8UL,_112UL>.buffer._4_4_,
                                                   result_1.Storage.storage.
                                                   super_AlignedCharArray<8UL,_112UL>.buffer._0_4_)
                                + 8))();
                  }
                }
                puVar9 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_590;
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(puVar9);
            llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
                      (&result.Storage);
          }
          else {
            testing::Message::Message((Message *)&gtest_ar__1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&result_1,(internal *)&result,(AssertionResult *)"loadingResult",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__3,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x256,(char *)CONCAT44(result_1.Storage.storage.
                                               super_AlignedCharArray<8UL,_112UL>.buffer._4_4_,
                                               result_1.Storage.storage.
                                               super_AlignedCharArray<8UL,_112UL>.buffer._0_4_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
            std::__cxx11::string::_M_dispose();
            if (gtest_ar__1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pcVar11);
          }
          llbuild::buildsystem::BuildSystem::~BuildSystem(&system);
          llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mockFS.
                      super___shared_ptr<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          goto LAB_00127009;
        }
        testing::Message::Message((Message *)&gtest_ar__1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&result,(internal *)&gtest_ar__3,
                   (AssertionResult *)
                   "strcmp(result.getValue().getStaleFileList()[0].str().c_str(), \"a.out\") == 0",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mockFS,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x236,(char *)CONCAT71(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>
                                           .buffer._1_7_,
                                           result.Storage.storage.super_AlignedCharArray<8UL,_112UL>
                                           .buffer[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&mockFS,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mockFS);
        std::__cxx11::string::_M_dispose();
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(puVar9);
    llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
              (&result_1.Storage);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&result_1,(internal *)&result,(AssertionResult *)"loadingResult","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x22f,(char *)CONCAT44(result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._4_4_,
                                       result_1.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__1)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::_M_dispose();
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pcVar3);
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&system_1);
  llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
LAB_00127009:
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&builddb);
  std::__cxx11::string::_M_dispose();
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&manifest);
  llbuild::TmpDir::~TmpDir(&tempDir);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemoval) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      description: STALE-FILE-REMOVAL
      expectedOutputs: ["a.out"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
    ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "a.out") == 0);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
  C.1:
    tool: stale-file-removal
    description: STALE-FILE-REMOVAL
    expectedOutputs: ["b.out"]
)END";
  }

  auto mockFS = std::make_shared<LoggingFileSystem>();
  std::unique_ptr<FileSystem> wrapFS(new FileSystemReferenceWrapper(*mockFS));
  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, std::move(wrapFS));
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
  ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "b.out") == 0);

  ASSERT_EQ(std::vector<std::string>({ "a.out" }), mockFS->getDeletedPaths());

  ASSERT_EQ(std::vector<std::string>({
    "commandPreparing(C.1)",
    "commandStarted(C.1)",
    "commandNote(C.1) Removed stale file 'a.out'\n",
    "commandFinished(C.1: 0)",
  }), delegate.getMessages());
}